

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

Hsh_IntObj_t * Hsh_IntObj(Hsh_IntMan_t *p,int iObj)

{
  if (iObj == -1) {
    return (Hsh_IntObj_t *)0x0;
  }
  if ((-1 < iObj) && (iObj < p->vObjs->nSize)) {
    return (Hsh_IntObj_t *)(p->vObjs->pArray + (uint)iObj);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

static inline Hsh_IntObj_t *  Hsh_IntObj( Hsh_IntMan_t * p, int iObj )    { return iObj == -1 ? NULL : (Hsh_IntObj_t *)Vec_WrdEntryP( p->vObjs, iObj ); }